

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

string * common_sampler_prev_str_abi_cxx11_
                   (string *__return_storage_ptr__,common_sampler *gsmpl,llama_context *ctx_main,
                   int n)

{
  uint uVar1;
  int *piVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_50;
  
  uVar1 = (uint)(gsmpl->prev).sz;
  if ((int)uVar1 < n) {
    n = uVar1;
  }
  paVar4 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar4;
  if (n < 1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    uVar3 = (ulong)(uint)n + 1;
    do {
      piVar2 = ring_buffer<int>::rat(&gsmpl->prev,uVar3 - 2);
      if (*piVar2 == -1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
                   ,0x1d0,"GGML_ASSERT(%s) failed",
                   "id != LLAMA_TOKEN_NULL && \"null token in the sampling history - should not happen\""
                   ,in_R8,in_R9,paVar4);
      }
      common_token_to_piece_abi_cxx11_(&local_50,ctx_main,*piVar2,true);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string common_sampler_prev_str(common_sampler * gsmpl, llama_context * ctx_main, int n) {
    n = std::min(n, (int) gsmpl->prev.size());

    if (n <= 0) {
        return "";
    }

    std::string result;
    result.reserve(8*n); // 8 is the average length of a token [citation needed], TODO: compute this from the vocab

    for (int i = n - 1; i >= 0; i--) {
        const llama_token id = gsmpl->prev.rat(i);

        GGML_ASSERT(id != LLAMA_TOKEN_NULL && "null token in the sampling history - should not happen");

        result += common_token_to_piece(ctx_main, id);
    }

    return result;
}